

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.cc
# Opt level: O0

int __thiscall
google::protobuf::io::CodedInputStream::ReadVarintSizeAsIntFallback(CodedInputStream *this)

{
  int iVar1;
  char *failure_msg;
  LogMessage *pLVar2;
  pair<bool,_const_unsigned_char_*> pVar3;
  pair<bool,_const_unsigned_char_*> p;
  uint64_t temp;
  CodedInputStream *this_local;
  uint8_t *local_78;
  bool local_69;
  uint8_t *local_68;
  uint8_t *next;
  LogMessage local_50;
  Voidify local_39;
  int local_38;
  uchar local_31;
  Nullable<const_char_*> local_30;
  Nullable<const_char_*> absl_log_internal_check_op_result;
  uchar *local_20;
  byte local_18;
  uint8_t *local_10;
  
  iVar1 = BufferSize(this);
  if ((iVar1 < 10) &&
     ((this->buffer_end_ <= this->buffer_ || ((this->buffer_end_[-1] & 0x80) != 0)))) {
    iVar1 = ReadVarintSizeAsIntSlow(this);
    return iVar1;
  }
  local_20 = this->buffer_;
  absl_log_internal_check_op_result = (Nullable<const_char_*>)&p.second;
  local_31 = absl::lts_20250127::log_internal::GetReferenceableValue(*local_20);
  local_38 = absl::lts_20250127::log_internal::GetReferenceableValue(0x80);
  local_30 = absl::lts_20250127::log_internal::Check_GEImpl<unsigned_char,int>
                       (&local_31,&local_38,"buffer[0] >= 128");
  if (local_30 != (Nullable<const_char_*>)0x0) {
    failure_msg = absl::lts_20250127::implicit_cast<char_const*>(local_30);
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_50,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/coded_stream.cc"
               ,0x1da,failure_msg);
    pLVar2 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_50);
    absl::lts_20250127::log_internal::Voidify::operator&&(&local_39,pLVar2);
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&local_50);
  }
  if (local_20[1] < 0x80) {
    local_68 = io::(anonymous_namespace)::DecodeVarint64KnownSize<2ul>
                         (local_20,(uint64_t *)absl_log_internal_check_op_result);
  }
  else if (local_20[2] < 0x80) {
    local_68 = io::(anonymous_namespace)::DecodeVarint64KnownSize<3ul>
                         (local_20,(uint64_t *)absl_log_internal_check_op_result);
  }
  else if (local_20[3] < 0x80) {
    local_68 = io::(anonymous_namespace)::DecodeVarint64KnownSize<4ul>
                         (local_20,(uint64_t *)absl_log_internal_check_op_result);
  }
  else if (local_20[4] < 0x80) {
    local_68 = io::(anonymous_namespace)::DecodeVarint64KnownSize<5ul>
                         (local_20,(uint64_t *)absl_log_internal_check_op_result);
  }
  else if (local_20[5] < 0x80) {
    local_68 = io::(anonymous_namespace)::DecodeVarint64KnownSize<6ul>
                         (local_20,(uint64_t *)absl_log_internal_check_op_result);
  }
  else if (local_20[6] < 0x80) {
    local_68 = io::(anonymous_namespace)::DecodeVarint64KnownSize<7ul>
                         (local_20,(uint64_t *)absl_log_internal_check_op_result);
  }
  else if (local_20[7] < 0x80) {
    local_68 = io::(anonymous_namespace)::DecodeVarint64KnownSize<8ul>
                         (local_20,(uint64_t *)absl_log_internal_check_op_result);
  }
  else if (local_20[8] < 0x80) {
    local_68 = io::(anonymous_namespace)::DecodeVarint64KnownSize<9ul>
                         (local_20,(uint64_t *)absl_log_internal_check_op_result);
  }
  else {
    if (0x7f < local_20[9]) {
      local_69 = false;
      local_78 = local_20 + 0xb;
      pVar3 = std::make_pair<bool,unsigned_char_const*>(&local_69,&local_78);
      local_10 = pVar3.second;
      local_18 = pVar3.first;
      goto LAB_0051a5d9;
    }
    local_68 = io::(anonymous_namespace)::DecodeVarint64KnownSize<10ul>
                         (local_20,(uint64_t *)absl_log_internal_check_op_result);
  }
  this_local._7_1_ = 1;
  pVar3 = std::make_pair<bool,unsigned_char_const*&>((bool *)((long)&this_local + 7),&local_68);
  local_10 = pVar3.second;
  local_18 = pVar3.first;
LAB_0051a5d9:
  if (((local_18 & 1) == 0) || ((uchar *)0x7fffffff < p.second)) {
    this_local._0_4_ = -1;
  }
  else {
    this->buffer_ = local_10;
    this_local._0_4_ = (int)p.second;
  }
  return (int)this_local;
}

Assistant:

int CodedInputStream::ReadVarintSizeAsIntFallback() {
  if (BufferSize() >= kMaxVarintBytes ||
      // Optimization:  We're also safe if the buffer is non-empty and it ends
      // with a byte that would terminate a varint.
      (buffer_end_ > buffer_ && !(buffer_end_[-1] & 0x80))) {
    uint64_t temp;
    ::std::pair<bool, const uint8_t*> p = ReadVarint64FromArray(buffer_, &temp);
    if (!p.first || temp > static_cast<uint64_t>(INT_MAX)) return -1;
    buffer_ = p.second;
    return temp;
  } else {
    // Really slow case: we will incur the cost of an extra function call here,
    // but moving this out of line reduces the size of this function, which
    // improves the common case. In micro benchmarks, this is worth about 10-15%
    return ReadVarintSizeAsIntSlow();
  }
}